

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

bool device_is_ready(int device_num)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  pointer pDVar4;
  ulong uVar5;
  pointer local_30;
  code *local_28;
  undefined8 local_20;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&RTLsMtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  uVar5 = ((long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7;
  pthread_mutex_unlock((pthread_mutex_t *)&RTLsMtx);
  uVar3 = (ulong)device_num;
  if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
LAB_0010370e:
    bVar1 = false;
  }
  else {
    if (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3].IsInit == false) {
      pDVar4 = Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
               super__Vector_impl_data._M_start + uVar3;
      local_28 = DeviceTy::init;
      local_20 = 0;
      local_30 = pDVar4;
      std::call_once<void(DeviceTy::*)(),DeviceTy*>
                (&pDVar4->InitFlag,(offset_in_DeviceTy_to_subr *)&local_28,&local_30);
      if (pDVar4->IsInit == false) goto LAB_0010370e;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool device_is_ready(int device_num) {
  DP("Checking whether device %d is ready.\n", device_num);
  // Devices.size() can only change while registering a new
  // library, so try to acquire the lock of RTLs' mutex.
  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();
  if (Devices_size <= (size_t)device_num) {
    DP("Device ID  %d does not have a matching RTL\n", device_num);
    return false;
  }

  // Get device info
  DeviceTy &Device = Devices[device_num];

  DP("Is the device %d (local ID %d) initialized? %d\n", device_num,
       Device.RTLDeviceID, Device.IsInit);

  // Init the device if not done before
  if (!Device.IsInit && Device.initOnce() != OFFLOAD_SUCCESS) {
    DP("Failed to init device %d\n", device_num);
    return false;
  }

  DP("Device %d is ready to use.\n", device_num);

  return true;
}